

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3_calculate_seek_points
                    (ma_dr_mp3 *pMP3,ma_uint32 *pSeekPointCount,ma_dr_mp3_seek_point *pSeekPoints)

{
  ma_uint64 mVar1;
  ma_bool32 mVar2;
  ma_uint32 mVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float runningPCMFrameCountFractionalPart;
  ma_uint64 runningPCMFrameCount;
  ulong local_a8;
  ma_uint32 *local_a0;
  ma_uint64 local_98;
  ma_dr_mp3_seek_point *local_90;
  ulong local_88;
  ulong local_80;
  ma_uint64 totalPCMFrameCount;
  ma_uint64 totalMP3FrameCount;
  ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo [3];
  
  if (pSeekPoints == (ma_dr_mp3_seek_point *)0x0 ||
      (pSeekPointCount == (ma_uint32 *)0x0 || pMP3 == (ma_dr_mp3 *)0x0)) {
    return 0;
  }
  uVar5 = (ulong)*pSeekPointCount;
  if (uVar5 == 0) {
    return 0;
  }
  mVar1 = pMP3->currentPCMFrame;
  mVar2 = ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3,&totalMP3FrameCount,&totalPCMFrameCount);
  if (mVar2 == 0) {
    return 0;
  }
  if (totalMP3FrameCount < 3) {
    pSeekPoints->seekPosInBytes = 0;
    pSeekPoints->pcmFrameIndex = 0;
    pSeekPoints->mp3FramesToDiscard = 0;
    pSeekPoints->pcmFramesToDiscard = 0;
    mVar3 = 1;
LAB_00173963:
    mVar2 = 1;
    *pSeekPointCount = mVar3;
  }
  else {
    runningPCMFrameCount = 0;
    runningPCMFrameCountFractionalPart = 0.0;
    local_a8 = (ulong)((int)totalMP3FrameCount - 1);
    if (uVar5 <= totalMP3FrameCount - 1) {
      local_a8 = uVar5;
    }
    local_80 = totalPCMFrameCount / ((int)local_a8 + 1);
    local_98 = mVar1;
    mVar2 = ma_dr_mp3_seek_to_start_of_stream(pMP3);
    if (mVar2 != 0) {
      for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
        *(ma_uint64 *)((long)mp3FrameInfo + lVar4 + -8) = pMP3->streamCursor - pMP3->dataSize;
        *(ma_uint64 *)((long)&mp3FrameInfo[0].bytePos + lVar4) = runningPCMFrameCount;
        mVar3 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
        if (mVar3 == 0) goto LAB_00173af7;
        ma_dr_mp3__accumulate_running_pcm_frame_count
                  (pMP3,mVar3,&runningPCMFrameCount,&runningPCMFrameCountFractionalPart);
      }
      local_88 = local_a8 & 0xffffffff;
      uVar6 = 0;
      local_a0 = pSeekPointCount;
      local_90 = pSeekPoints;
      for (uVar5 = 0; uVar5 != local_88; uVar5 = uVar5 + 1) {
        uVar6 = uVar6 + local_80;
        while (runningPCMFrameCount <= uVar6) {
          mp3FrameInfo[0].bytePos = mp3FrameInfo[1].bytePos;
          mp3FrameInfo[0].pcmFrameIndex = mp3FrameInfo[1].pcmFrameIndex;
          mp3FrameInfo[1].bytePos = mp3FrameInfo[2].bytePos;
          mp3FrameInfo[1].pcmFrameIndex = mp3FrameInfo[2].pcmFrameIndex;
          mp3FrameInfo[2].bytePos = pMP3->streamCursor - pMP3->dataSize;
          mp3FrameInfo[2].pcmFrameIndex = runningPCMFrameCount;
          mVar3 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)0x0);
          if (mVar3 == 0) break;
          ma_dr_mp3__accumulate_running_pcm_frame_count
                    (pMP3,mVar3,&runningPCMFrameCount,&runningPCMFrameCountFractionalPart);
        }
        local_90[uVar5].seekPosInBytes = mp3FrameInfo[0].bytePos;
        local_90[uVar5].pcmFrameIndex = uVar6;
        local_90[uVar5].mp3FramesToDiscard = 2;
        local_90[uVar5].pcmFramesToDiscard = (short)uVar6 - (short)mp3FrameInfo[1].pcmFrameIndex;
      }
      mVar2 = ma_dr_mp3_seek_to_start_of_stream(pMP3);
      pSeekPointCount = local_a0;
      if (mVar2 != 0) {
        mVar2 = ma_dr_mp3_seek_to_pcm_frame(pMP3,local_98);
        mVar3 = (ma_uint32)local_a8;
        if (mVar2 != 0) goto LAB_00173963;
      }
    }
LAB_00173af7:
    mVar2 = 0;
  }
  return mVar2;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_calculate_seek_points(ma_dr_mp3* pMP3, ma_uint32* pSeekPointCount, ma_dr_mp3_seek_point* pSeekPoints)
{
    ma_uint32 seekPointCount;
    ma_uint64 currentPCMFrame;
    ma_uint64 totalMP3FrameCount;
    ma_uint64 totalPCMFrameCount;
    if (pMP3 == NULL || pSeekPointCount == NULL || pSeekPoints == NULL) {
        return MA_FALSE;
    }
    seekPointCount = *pSeekPointCount;
    if (seekPointCount == 0) {
        return MA_FALSE;
    }
    currentPCMFrame = pMP3->currentPCMFrame;
    if (!ma_dr_mp3_get_mp3_and_pcm_frame_count(pMP3, &totalMP3FrameCount, &totalPCMFrameCount)) {
        return MA_FALSE;
    }
    if (totalMP3FrameCount < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1) {
        seekPointCount = 1;
        pSeekPoints[0].seekPosInBytes     = 0;
        pSeekPoints[0].pcmFrameIndex      = 0;
        pSeekPoints[0].mp3FramesToDiscard = 0;
        pSeekPoints[0].pcmFramesToDiscard = 0;
    } else {
        ma_uint64 pcmFramesBetweenSeekPoints;
        ma_dr_mp3__seeking_mp3_frame_info mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1];
        ma_uint64 runningPCMFrameCount = 0;
        float runningPCMFrameCountFractionalPart = 0;
        ma_uint64 nextTargetPCMFrame;
        ma_uint32 iMP3Frame;
        ma_uint32 iSeekPoint;
        if (seekPointCount > totalMP3FrameCount-1) {
            seekPointCount = (ma_uint32)totalMP3FrameCount-1;
        }
        pcmFramesBetweenSeekPoints = totalPCMFrameCount / (seekPointCount+1);
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        for (iMP3Frame = 0; iMP3Frame < MA_DR_MP3_SEEK_LEADING_MP3_FRAMES+1; ++iMP3Frame) {
            ma_uint32 pcmFramesInCurrentMP3FrameIn;
            MA_DR_MP3_ASSERT(pMP3->streamCursor >= pMP3->dataSize);
            mp3FrameInfo[iMP3Frame].bytePos       = pMP3->streamCursor - pMP3->dataSize;
            mp3FrameInfo[iMP3Frame].pcmFrameIndex = runningPCMFrameCount;
            pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
            if (pcmFramesInCurrentMP3FrameIn == 0) {
                return MA_FALSE;
            }
            ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
        }
        nextTargetPCMFrame = 0;
        for (iSeekPoint = 0; iSeekPoint < seekPointCount; ++iSeekPoint) {
            nextTargetPCMFrame += pcmFramesBetweenSeekPoints;
            for (;;) {
                if (nextTargetPCMFrame < runningPCMFrameCount) {
                    pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                    pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                    pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                    pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                    break;
                } else {
                    size_t i;
                    ma_uint32 pcmFramesInCurrentMP3FrameIn;
                    for (i = 0; i < MA_DR_MP3_COUNTOF(mp3FrameInfo)-1; ++i) {
                        mp3FrameInfo[i] = mp3FrameInfo[i+1];
                    }
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].bytePos       = pMP3->streamCursor - pMP3->dataSize;
                    mp3FrameInfo[MA_DR_MP3_COUNTOF(mp3FrameInfo)-1].pcmFrameIndex = runningPCMFrameCount;
                    pcmFramesInCurrentMP3FrameIn = ma_dr_mp3_decode_next_frame_ex(pMP3, NULL);
                    if (pcmFramesInCurrentMP3FrameIn == 0) {
                        pSeekPoints[iSeekPoint].seekPosInBytes     = mp3FrameInfo[0].bytePos;
                        pSeekPoints[iSeekPoint].pcmFrameIndex      = nextTargetPCMFrame;
                        pSeekPoints[iSeekPoint].mp3FramesToDiscard = MA_DR_MP3_SEEK_LEADING_MP3_FRAMES;
                        pSeekPoints[iSeekPoint].pcmFramesToDiscard = (ma_uint16)(nextTargetPCMFrame - mp3FrameInfo[MA_DR_MP3_SEEK_LEADING_MP3_FRAMES-1].pcmFrameIndex);
                        break;
                    }
                    ma_dr_mp3__accumulate_running_pcm_frame_count(pMP3, pcmFramesInCurrentMP3FrameIn, &runningPCMFrameCount, &runningPCMFrameCountFractionalPart);
                }
            }
        }
        if (!ma_dr_mp3_seek_to_start_of_stream(pMP3)) {
            return MA_FALSE;
        }
        if (!ma_dr_mp3_seek_to_pcm_frame(pMP3, currentPCMFrame)) {
            return MA_FALSE;
        }
    }
    *pSeekPointCount = seekPointCount;
    return MA_TRUE;
}